

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoods
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  double *pdVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  int k;
  long lVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 in_XMM2_Qb;
  
  uVar2 = this->kPatternCount;
  lVar16 = 0;
  pfVar4 = this->gCategoryWeights[categoryWeightsIndex];
  pfVar5 = this->gStateFrequencies[stateFrequenciesIndex];
  pfVar6 = this->gPartials[bufferIndex];
  uVar14 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
  uVar10 = ~((int)uVar2 >> 0x1f) & uVar2;
  iVar12 = 0;
  uVar15 = uVar14;
  for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
    lVar13 = (long)iVar12;
    pfVar7 = this->integrationTmp;
    iVar12 = iVar12 + uVar14;
    for (lVar19 = 0; (int)uVar15 - lVar13 != lVar19; lVar19 = lVar19 + 1) {
      pfVar7[(int)lVar16 + lVar19] = pfVar6[lVar13 + lVar19] * *pfVar4;
    }
    uVar15 = uVar15 + uVar14;
    lVar16 = (int)lVar16 + lVar19;
  }
  iVar3 = this->kCategoryCount;
  for (lVar16 = 1; lVar16 < iVar3; lVar16 = lVar16 + 1) {
    iVar18 = 0;
    uVar14 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
    uVar15 = uVar14;
    for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
      lVar19 = (long)iVar18;
      pfVar7 = this->integrationTmp;
      for (lVar13 = 0; (int)uVar15 - lVar19 != lVar13; lVar13 = lVar13 + 1) {
        auVar21 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[lVar16]),
                                  ZEXT416((uint)pfVar6[iVar12 + lVar13]),
                                  ZEXT416((uint)pfVar7[lVar19 + lVar13]));
        pfVar7[lVar19 + lVar13] = auVar21._0_4_;
      }
      iVar12 = iVar12 + (int)lVar13;
      uVar15 = uVar15 + uVar14;
      iVar18 = iVar18 + uVar14;
    }
  }
  lVar13 = 0;
  for (lVar16 = 0; lVar16 < (int)uVar2; lVar16 = lVar16 + 1) {
    auVar21 = ZEXT816(0) << 0x40;
    uVar9 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)pfVar5[uVar11]),
                                ZEXT416((uint)this->integrationTmp[(long)(int)lVar13 + uVar11]));
    }
    lVar13 = (long)(int)lVar13 + uVar9;
    dVar20 = log((double)auVar21._0_4_);
    this->outLogLikelihoodsTmp[lVar16] = (float)dVar20;
    uVar2 = this->kPatternCount;
  }
  if (scalingFactorsIndex < 0) {
    uVar9 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
  }
  else {
    pfVar4 = this->outLogLikelihoodsTmp;
    pfVar5 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    uVar9 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      pfVar4[uVar11] = pfVar5[uVar11] + pfVar4[uVar11];
    }
  }
  *outSumLogLikelihood = 0.0;
  auVar21 = ZEXT816(0) << 0x40;
  pdVar8 = this->gPatternWeights;
  pfVar4 = this->outLogLikelihoodsTmp;
  for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    auVar22._0_8_ = (double)pfVar4[uVar11];
    auVar22._8_8_ = in_XMM2_Qb;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar8[uVar11];
    auVar21 = vfmadd231sd_fma(auVar21,auVar22,auVar1);
    *outSumLogLikelihood = auVar21._0_8_;
  }
  return (uint)!NAN(auVar21._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                            const int categoryWeightsIndex,
                            const int stateFrequenciesIndex,
                            const int scalingFactorsIndex,
                            double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];
    int u = 0;
    int v = 0;
    for (int k = 0; k < kPatternCount; k++) {
        for (int i = 0; i < kStateCount; i++) {
            integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
            u++;
            v++;
        }
        v += P_PAD;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                u++;
                v++;
            }
            v += P_PAD;
        }
    }
    u = 0;
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE sum = 0.0;
        for (int i = 0; i < kStateCount; i++) {
            sum += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sum);
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        for(int i=0; i<kPatternCount; i++) {
            outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
        }
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    // TODO: merge the three kPatternCount loops above into one

    return returnCode;
}